

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.cpp
# Opt level: O2

SHA3_256 * __thiscall SHA3_256::Finalize(SHA3_256 *this,Span<unsigned_char> output)

{
  byte *pbVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (output.m_size != 0x20) {
    __assert_fail("output.size() == OUTPUT_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/sha3.cpp"
                  ,0x8a,"SHA3_256 &SHA3_256::Finalize(Span<unsigned char>)");
  }
  for (uVar3 = (ulong)this->m_bufsize; uVar3 != 8; uVar3 = uVar3 + 1) {
    this->m_buffer[uVar3] = '\0';
  }
  this->m_buffer[this->m_bufsize] = this->m_buffer[this->m_bufsize] ^ 6;
  this->m_state[this->m_pos] = this->m_state[this->m_pos] ^ *(ulong *)this->m_buffer;
  pbVar1 = (byte *)((long)this->m_state + 0x87);
  *pbVar1 = *pbVar1 ^ 0x80;
  KeccakF(this->m_state);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(uint64_t *)(output.m_data + lVar4 * 8) = this->m_state[lVar4];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

SHA3_256& SHA3_256::Finalize(Span<unsigned char> output)
{
    assert(output.size() == OUTPUT_SIZE);
    std::fill(m_buffer + m_bufsize, m_buffer + sizeof(m_buffer), 0);
    m_buffer[m_bufsize] ^= 0x06;
    m_state[m_pos] ^= ReadLE64(m_buffer);
    m_state[RATE_BUFFERS - 1] ^= 0x8000000000000000;
    KeccakF(m_state);
    for (unsigned i = 0; i < 4; ++i) {
        WriteLE64(output.data() + 8 * i, m_state[i]);
    }
    return *this;
}